

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O0

usize Unicode::length(char ch)

{
  usize uStack_10;
  char ch_local;
  
  if (((int)ch & 0x80U) == 0) {
    uStack_10 = 1;
  }
  else if (((int)ch & 0xe0U) == 0xc0) {
    uStack_10 = 2;
  }
  else if (((int)ch & 0xf0U) == 0xe0) {
    uStack_10 = 3;
  }
  else if (((int)ch & 0xf8U) == 0xf0) {
    uStack_10 = 4;
  }
  else {
    uStack_10 = 0;
  }
  return uStack_10;
}

Assistant:

static usize length(char ch)
  {
    if((ch & 0x80) == 0)
      return 1;
    if((ch & 0xe0) == 0xc0)
      return 2;
    if((ch & 0xf0) == 0xe0)
      return 3;
    if((ch & 0xf8) == 0xf0)
      return 4;
    return 0;
  }